

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdAlias.c
# Opt level: O1

char * CmdCommandAliasLookup(Abc_Frame_t *pAbc,char *sCommand)

{
  int iVar1;
  char *value;
  char *local_10;
  
  iVar1 = st__lookup(pAbc->tAliases,sCommand,&local_10);
  if (iVar1 != 0) {
    sCommand = (char *)**(undefined8 **)(local_10 + 0x10);
  }
  return sCommand;
}

Assistant:

char * CmdCommandAliasLookup( Abc_Frame_t * pAbc, char * sCommand )
{
  Abc_Alias * pAlias;
  char * value;
  if (! st__lookup( pAbc->tAliases, sCommand, &value)) 
    return sCommand;
  pAlias = (Abc_Alias *) value;
  return pAlias->argv[0];
}